

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

Move<vk::VkDevice_s_*> *
vkt::wsi::anon_unknown_0::createDeviceWithWsi
          (Move<vk::VkDevice_s_*> *__return_storage_ptr__,InstanceInterface *vki,
          VkPhysicalDevice physicalDevice,Extensions *supportedExtensions,deUint32 queueFamilyIndex,
          VkAllocationCallbacks *pAllocator)

{
  bool bVar1;
  NotSupportedError *this;
  char *pcVar2;
  allocator<char> local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  Maybe<unsigned_int> local_238;
  Maybe<unsigned_int> local_228 [2];
  allocator<char> local_201;
  string local_200;
  RequiredExtension local_1e0;
  int local_19c;
  undefined1 local_198 [4];
  int ndx;
  VkDeviceCreateInfo deviceParams;
  char *extensions [1];
  VkPhysicalDeviceFeatures features;
  VkDeviceQueueCreateInfo queueInfos [1];
  float queuePriorities [1];
  VkAllocationCallbacks *pAllocator_local;
  deUint32 queueFamilyIndex_local;
  Extensions *supportedExtensions_local;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *vki_local;
  
  queueInfos[0].pQueuePriorities._4_4_ = 0x3f800000;
  features.variableMultisampleRate = 2;
  queueInfos[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  queueInfos[0]._4_4_ = 0;
  queueInfos[0].pNext._0_4_ = 0;
  queueInfos[0].flags = 1;
  queueInfos[0]._24_8_ = (long)&queueInfos[0].pQueuePriorities + 4;
  queueInfos[0].pNext._4_4_ = queueFamilyIndex;
  getDeviceFeaturesForWsi();
  deviceParams.pEnabledFeatures = (VkPhysicalDeviceFeatures *)anon_var_dwarf_1e027e;
  local_198 = (undefined1  [4])0x3;
  deviceParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  deviceParams._4_4_ = 0;
  deviceParams.pNext._0_4_ = 0;
  deviceParams.pNext._4_4_ = 1;
  deviceParams._16_8_ = &features.variableMultisampleRate;
  deviceParams.pQueueCreateInfos._0_4_ = 0;
  deviceParams.enabledLayerCount = 0;
  deviceParams._36_4_ = 0;
  deviceParams.ppEnabledLayerNames._0_4_ = 1;
  deviceParams._48_8_ = &deviceParams.pEnabledFeatures;
  deviceParams.ppEnabledExtensionNames = (char **)((long)extensions + 4);
  local_19c = 0;
  while( true ) {
    if (0 < local_19c) {
      ::vk::createDevice(__return_storage_ptr__,vki,physicalDevice,(VkDeviceCreateInfo *)local_198,
                         pAllocator);
      return __return_storage_ptr__;
    }
    pcVar2 = extensions[(long)local_19c + -1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,pcVar2,&local_201);
    tcu::nothing<unsigned_int>();
    tcu::nothing<unsigned_int>();
    ::vk::RequiredExtension::RequiredExtension(&local_1e0,&local_200,local_228,&local_238);
    bVar1 = ::vk::isExtensionSupported(supportedExtensions,&local_1e0);
    ::vk::RequiredExtension::~RequiredExtension(&local_1e0);
    tcu::Maybe<unsigned_int>::~Maybe(&local_238);
    tcu::Maybe<unsigned_int>::~Maybe(local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    local_19c = local_19c + 1;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  pcVar2 = extensions[(long)local_19c + -1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,pcVar2,&local_279);
  std::operator+(&local_258,&local_278," is not supported");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  tcu::NotSupportedError::NotSupportedError
            (this,pcVar2,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
             ,0x94);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

Move<VkDevice> createDeviceWithWsi (const InstanceInterface&		vki,
									VkPhysicalDevice				physicalDevice,
									const Extensions&				supportedExtensions,
									const deUint32					queueFamilyIndex,
									const VkAllocationCallbacks*	pAllocator = DE_NULL)
{
	const float						queuePriorities[]	= { 1.0f };
	const VkDeviceQueueCreateInfo	queueInfos[]		=
	{
		{
			VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,
			DE_NULL,
			(VkDeviceQueueCreateFlags)0,
			queueFamilyIndex,
			DE_LENGTH_OF_ARRAY(queuePriorities),
			&queuePriorities[0]
		}
	};
	const VkPhysicalDeviceFeatures	features		= getDeviceFeaturesForWsi();
	const char* const				extensions[]	= { "VK_KHR_swapchain" };
	const VkDeviceCreateInfo		deviceParams	=
	{
		VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,
		DE_NULL,
		(VkDeviceCreateFlags)0,
		DE_LENGTH_OF_ARRAY(queueInfos),
		&queueInfos[0],
		0u,									// enabledLayerCount
		DE_NULL,							// ppEnabledLayerNames
		DE_LENGTH_OF_ARRAY(extensions),		// enabledExtensionCount
		DE_ARRAY_BEGIN(extensions),			// ppEnabledExtensionNames
		&features
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(extensions); ++ndx)
	{
		if (!isExtensionSupported(supportedExtensions, RequiredExtension(extensions[ndx])))
			TCU_THROW(NotSupportedError, (string(extensions[ndx]) + " is not supported").c_str());
	}

	return createDevice(vki, physicalDevice, &deviceParams, pAllocator);
}